

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<std::pair<unsigned_int,unsigned_int>>::
sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(void *param_1)

{
  unsigned_long uVar1;
  int iVar2;
  Comparison CVar3;
  size_t sVar4;
  pair<unsigned_int,_unsigned_int> *ppVar5;
  pair<unsigned_int,_unsigned_int> *ppVar6;
  unsigned_long *puVar7;
  pair<unsigned_int,_unsigned_int> aux_1;
  pair<unsigned_int,_unsigned_int> aux;
  size_t r;
  size_t l;
  pair<unsigned_int,_unsigned_int> mid;
  size_t m;
  size_t p;
  size_t to;
  size_t from;
  pair<unsigned_int,_unsigned_int> *in_stack_ffffffffffffff38;
  GVArrComparator *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  DArray<unsigned_long> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  DArray<unsigned_long> *in_stack_ffffffffffffff68;
  pair<unsigned_int,_unsigned_int> local_68;
  pair<unsigned_int,_unsigned_int> local_60;
  ulong local_58;
  unsigned_long local_50;
  pair<unsigned_int,_unsigned_int> local_48;
  size_t local_40;
  size_t local_38;
  ulong local_30;
  unsigned_long local_28;
  void *local_10;
  
  if (1 < *param_1) {
    local_10 = param_1;
    if ((sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
         ::ft == '\0') &&
       (iVar2 = __cxa_guard_acquire(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                                     ::ft), iVar2 != 0)) {
      DArray<unsigned_long>::DArray(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &DArray<std::pair<unsigned_int,_unsigned_int>_>::
                    sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,&__dso_handle)
      ;
      __cxa_guard_release(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                           ::ft);
    }
    local_28 = 0;
    sVar4 = DArray<std::pair<unsigned_int,_unsigned_int>_>::size
                      ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1);
    local_30 = sVar4 - 1;
    DArray<unsigned_long>::ensure
              (in_stack_ffffffffffffff68,
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_38 = 0;
    while( true ) {
      do {
        uVar1 = local_28;
        iVar2 = Random::getInteger((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        local_40 = uVar1 + (long)iVar2;
        ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                           ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_40);
        local_48 = *ppVar5;
        local_50 = local_28;
        local_58 = local_30;
        while (local_50 < local_40) {
          DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                    ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_50);
          CVar3 = Indexing::CodeTree::ILStruct::GVArrComparator::compare
                            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                             (pair<unsigned_int,_unsigned_int> *)0x34b91a);
          if ((uint)(CVar3 + GREATER) < 2) {
            local_50 = local_50 + 1;
          }
          else if (CVar3 == GREATER) {
            if (local_40 == local_58) {
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_50
                                 );
              ppVar6 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_40
                                 );
              std::pair<unsigned_int,_unsigned_int>::operator=(ppVar6,ppVar5);
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                  local_40 - 1);
              ppVar6 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_50
                                 );
              std::pair<unsigned_int,_unsigned_int>::operator=(ppVar6,ppVar5);
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                  local_40 - 1);
              std::pair<unsigned_int,_unsigned_int>::operator=(ppVar5,&local_48);
              local_40 = local_40 - 1;
            }
            else {
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_50
                                 );
              local_60 = *ppVar5;
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_58
                                 );
              ppVar6 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_50
                                 );
              std::pair<unsigned_int,_unsigned_int>::operator=(ppVar6,ppVar5);
              ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                                 ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_58
                                 );
              std::pair<unsigned_int,_unsigned_int>::operator=(ppVar5,&local_60);
            }
            local_58 = local_58 - 1;
          }
        }
        while (sVar4 = local_38, local_40 < local_58) {
          DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                    ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_40 + 1);
          CVar3 = Indexing::CodeTree::ILStruct::GVArrComparator::compare
                            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                             (pair<unsigned_int,_unsigned_int> *)0x34baf2);
          if (CVar3 == LESS) {
            ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_58);
            local_68 = *ppVar5;
            ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                local_40 + 1);
            ppVar6 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_58);
            std::pair<unsigned_int,_unsigned_int>::operator=(ppVar6,ppVar5);
            ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                local_40 + 1);
            std::pair<unsigned_int,_unsigned_int>::operator=(ppVar5,&local_68);
            local_58 = local_58 - 1;
          }
          else if ((uint)CVar3 < 2) {
            ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                local_40 + 1);
            ppVar6 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,local_40);
            std::pair<unsigned_int,_unsigned_int>::operator=(ppVar6,ppVar5);
            ppVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::operator[]
                               ((DArray<std::pair<unsigned_int,_unsigned_int>_> *)param_1,
                                local_40 + 1);
            std::pair<unsigned_int,_unsigned_int>::operator=(ppVar5,&local_48);
            local_40 = local_40 + 1;
          }
        }
        if (local_40 + 1 < local_30) {
          in_stack_ffffffffffffff40 = (GVArrComparator *)(local_40 + 1);
          local_38 = local_38 + 1;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                               sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,
                              sVar4);
          sVar4 = local_38;
          *puVar7 = (unsigned_long)in_stack_ffffffffffffff40;
          local_38 = local_38 + 1;
          puVar7 = DArray<unsigned_long>::operator[]
                             (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                               sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,
                              sVar4);
          *puVar7 = local_30;
        }
        local_30 = local_40 - 1;
      } while ((local_40 != 0) && (local_28 < local_30));
      if (local_38 == 0) break;
      local_38 = local_38 - 2;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                           sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,
                          local_38);
      local_28 = *puVar7;
      puVar7 = DArray<unsigned_long>::operator[]
                         (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                           sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,
                          local_38 + 1);
      local_30 = *puVar7;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }